

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O3

void build_terminal_node_mappings_single_tree<IsoTree>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *mappings,size_t *n_terminal,
               vector<IsoTree,_std::allocator<IsoTree>_> *tree)

{
  pointer __s;
  pointer pIVar1;
  size_t *psVar2;
  long lVar3;
  pointer puVar4;
  size_t sVar5;
  long lVar6;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (mappings,((long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  puVar4 = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (puVar4 != (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
    _S_do_it(mappings);
    puVar4 = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  __s = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  if (__s != puVar4) {
    memset(__s,0,((long)puVar4 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  *n_terminal = 0;
  pIVar1 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pIVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 4) * 0x6db6db6db6db6db7;
    psVar2 = &pIVar1->tree_left;
    sVar5 = 0;
    lVar6 = 0;
    do {
      if (*psVar2 == 0) {
        __s[lVar6] = sVar5;
        sVar5 = *n_terminal + 1;
        *n_terminal = sVar5;
      }
      lVar6 = lVar6 + 1;
      psVar2 = psVar2 + 0xe;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar6);
  }
  return;
}

Assistant:

void build_terminal_node_mappings_single_tree(std::vector<size_t> &mappings, size_t &n_terminal, const std::vector<Tree> &tree)
{
    mappings.resize(tree.size());
    mappings.shrink_to_fit();
    std::fill(mappings.begin(), mappings.end(), (size_t)0);
    
    n_terminal = 0;
    for (size_t node = 0; node < tree.size(); node++)
    {
        if (is_terminal_node(tree[node]))
        {
            mappings[node] = n_terminal;
            n_terminal++;
        }
    }
}